

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_ctx.cc
# Opt level: O2

EVP_PKEY_CTX * EVP_PKEY_CTX_new_id(int id,ENGINE *e)

{
  undefined8 *puVar1;
  long lVar2;
  EVP_PKEY_CTX *pEVar3;
  
  lVar2 = 0;
  do {
    if (lVar2 == 0x28) {
      ERR_put_error(6,0,0x80,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                    ,0x59);
      ERR_add_error_dataf("algorithm %d",id);
      return (EVP_PKEY_CTX *)0x0;
    }
    puVar1 = (undefined8 *)((long)evp_methods + lVar2);
    lVar2 = lVar2 + 8;
  } while (((EVP_PKEY_METHOD *)*puVar1)->pkey_id != id);
  pEVar3 = evp_pkey_ctx_new((EVP_PKEY *)0x0,(ENGINE *)e,(EVP_PKEY_METHOD *)*puVar1);
  return (EVP_PKEY_CTX *)pEVar3;
}

Assistant:

EVP_PKEY_CTX *EVP_PKEY_CTX_new_id(int id, ENGINE *e) {
  const EVP_PKEY_METHOD *pkey_method = evp_pkey_meth_find(id);
  if (pkey_method == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
    ERR_add_error_dataf("algorithm %d", id);
    return NULL;
  }

  return evp_pkey_ctx_new(NULL, e, pkey_method);
}